

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_sched_perf.cpp
# Opt level: O0

double bench_sched_perf(size_t ntasks)

{
  double dVar1;
  bool bVar2;
  _Setw _Var3;
  ostream *poVar4;
  reference pdVar5;
  double dVar6;
  double baseline_time;
  double t_1;
  iterator __end3;
  iterator __begin3;
  vector<double,_std::allocator<double>_> *__range3;
  double parallel_time;
  double t;
  iterator __end4;
  iterator __begin4;
  vector<double,_std::allocator<double>_> *__range4;
  double serial_time;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff80;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_58;
  vector<double,_std::allocator<double>_> *local_50;
  undefined8 in_stack_ffffffffffffffb8;
  int nreps;
  undefined4 in_stack_ffffffffffffffc0;
  _Setw in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  int nreps_00;
  size_t in_stack_ffffffffffffffd0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_28;
  vector<double,_std::allocator<double>_> *local_20;
  double local_18;
  double local_8;
  
  nreps_00 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  nreps = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_18 = 0.0;
  if (!OnlyParallelRun) {
    if (!ClearCaches) {
      bench_parallel_time(CONCAT44(in_stack_ffffffffffffffc4._M_n,in_stack_ffffffffffffffc0),nreps);
    }
    local_18 = bench_serial_time(in_stack_ffffffffffffffd0,nreps_00);
    nreps = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    if (Verbosity != 0) {
      if (1 < Verbosity) {
        local_20 = &TSeq;
        local_28._M_current =
             (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
        std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff78);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (in_stack_ffffffffffffff80,
                             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                              *)in_stack_ffffffffffffff78);
          nreps = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
          if (!bVar2) break;
          pdVar5 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator*(&local_28);
          dVar6 = *pdVar5;
          in_stack_ffffffffffffffc4 = std::setw(8);
          poVar4 = std::operator<<((ostream *)&std::cout,in_stack_ffffffffffffffc4);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar6);
          std::operator<<(poVar4,' ');
          __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator++(&local_28);
        }
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"  serial time=");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_18);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  dVar6 = bench_parallel_time(CONCAT44(in_stack_ffffffffffffffc4._M_n,in_stack_ffffffffffffffc0),
                              nreps);
  if (Verbosity != 0) {
    if (1 < Verbosity) {
      local_50 = &TPar;
      local_58._M_current =
           (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff78);
      while (bVar2 = __gnu_cxx::operator!=
                               (in_stack_ffffffffffffff80,
                                (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                 *)in_stack_ffffffffffffff78), bVar2) {
        pdVar5 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_58);
        dVar1 = *pdVar5;
        _Var3 = std::setw(8);
        poVar4 = std::operator<<((ostream *)&std::cout,_Var3);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar1);
        std::operator<<(poVar4,' ');
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator++(&local_58);
      }
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"parallel time=");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar6);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  if ((OnlyParallelRun & 1U) == 0) {
    if (((UseSameTile & 1U) == 0) && ((ParallelBaseline & 1U) == 0)) {
      local_18 = local_18 / (double)Nthreads;
    }
    local_8 = dVar6 / local_18;
  }
  else {
    local_8 = 1.0;
  }
  return local_8;
}

Assistant:

double bench_sched_perf(const size_t ntasks)
{ double serial_time = 0.;
  
  if (!OnlyParallelRun) {
    
    // heat the caches if they are not going to be cleaned.
    //It is not done in profiling runs because of the runtime impact
    if (!ClearCaches) {
      bench_parallel_time(ntasks, 1);
    }
    
    serial_time = bench_serial_time(ntasks, NReps);
    if(Verbosity) {
      if (Verbosity > 1) {
        for (double t : TSeq) {
          std::cout << std::setw(8) << t << ' ';
        }
      }
      std::cout << "  serial time=" << serial_time << std::endl;
    }
  }

  const double parallel_time = bench_parallel_time(ntasks, NReps);
  if(Verbosity) {
    if (Verbosity > 1) {
      for (double t : TPar) {
        std::cout << std::setw(8) << t << ' ';
      }
    }
    std::cout << "parallel time=" << parallel_time << std::endl;
  }
  
  if (OnlyParallelRun) {
    return 1.0;
  } else {
    // if UseSameTile the runtime cannot scale linearly, and if ParallelBaseline we just want a one-to-one comparison
    //So only in sequential baselines with different tiles do we compare with the theoretical Time/Nthreads scaling
    const double baseline_time = (UseSameTile || ParallelBaseline) ? serial_time : (serial_time / Nthreads);
    return parallel_time / baseline_time;
  }
}